

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::read_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  mutex *__mutex;
  bool bVar1;
  int iVar2;
  ulong blob_size_00;
  size_t sVar3;
  Entry entry;
  Entry local_40;
  
  if (this->alive != true) {
    return false;
  }
  if (this->mode != ReadOnly) {
    return false;
  }
  bVar1 = find_entry(this,tag,hash,&local_40);
  if (blob_size == (size_t *)0x0) {
    return false;
  }
  if (bVar1) {
    if ((flags & 1) != 0) {
      local_40.header.uncompressed_size = local_40.header.payload_size + 0x10;
    }
    blob_size_00 = (ulong)local_40.header.uncompressed_size;
    if ((blob == (void *)0x0) || (blob_size_00 <= *blob_size)) {
      *blob_size = blob_size_00;
      if (blob == (void *)0x0) {
        return true;
      }
      if ((flags & 1) == 0) {
        bVar1 = decode_payload(this,blob,blob_size_00,&local_40,SUB41((flags & 2) >> 1,0));
        if (bVar1) {
          return true;
        }
      }
      else {
        __mutex = &this->read_lock;
        if (((flags & 2) != 0) &&
           (iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex), iVar2 != 0)) {
          std::__throw_system_error(iVar2);
        }
        iVar2 = fseek((FILE *)this->file,local_40.offset - 0x10,0);
        if (iVar2 < 0) {
          if ((flags & 2) != 0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
        }
        else {
          sVar3 = fread(blob,1,(ulong)local_40.header.payload_size + 0x10,(FILE *)this->file);
          if ((flags & 2) != 0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          if (sVar3 == (ulong)local_40.header.payload_size + 0x10) {
            return true;
          }
        }
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if (!alive || mode != DatabaseMode::ReadOnly)
			return false;

		Entry entry;
		if (!find_entry(tag, hash, entry))
			return false;

		if (!blob_size)
			return false;

		uint32_t out_size = (flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0 ?
		                    (entry.header.payload_size + sizeof(PayloadHeaderRaw)) :
		                    entry.header.uncompressed_size;

		if (blob && *blob_size < out_size)
			return false;
		*blob_size = out_size;

		if (blob)
		{
			if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			{
				// Include the header.
				ConditionalLockGuard holder(read_lock, (flags & PAYLOAD_READ_CONCURRENT_BIT) != 0);
				if (fseek(file, entry.offset - sizeof(PayloadHeaderRaw), SEEK_SET) < 0)
					return false;

				size_t read_size = entry.header.payload_size + sizeof(PayloadHeaderRaw);
				if (fread(blob, 1, read_size, file) != read_size)
					return false;
			}
			else
			{
				if (!decode_payload(blob, out_size, entry, (flags & PAYLOAD_READ_CONCURRENT_BIT) != 0))
					return false;
			}
		}

		return true;
	}